

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinDiff.cc
# Opt level: O0

void print_binary_diff(FILE *stream,void *data1v,size_t size1,void *data2v,size_t size2,
                      bool use_color,size_t context_lines,uint64_t base_offset)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  uint64_t *puVar4;
  uint local_f8;
  uint local_f4;
  size_t local_f0;
  size_t z;
  size_t chunk_start_line_index;
  bool has_unprinted_gap;
  uint16_t data2_value;
  uint16_t data1_value;
  size_t offset;
  size_t within_line_offset;
  size_t sStack_c0;
  uint16_t diff_flags;
  size_t line_index;
  size_t num_lines;
  ssize_t last_different_line_index;
  size_t first_unprinted_line_index;
  anon_class_40_5_ac5c238a print_diff_line_pair;
  anon_class_32_4_ace858be print_diff_line;
  int offset_width_digits;
  size_t max_data_size;
  uint8_t *data2;
  uint8_t *data1;
  uint64_t *puStack_30;
  bool use_color_local;
  size_t size2_local;
  void *data2v_local;
  size_t size1_local;
  void *data1v_local;
  FILE *stream_local;
  
  max_data_size = (size_t)data2v;
  data2 = (uint8_t *)data1v;
  data1._7_1_ = use_color;
  puStack_30 = (uint64_t *)size2;
  size2_local = (size_t)data2v;
  data2v_local = (void *)size1;
  size1_local = (size_t)data1v;
  data1v_local = stream;
  puVar2 = std::max<unsigned_long>
                     ((unsigned_long *)&data2v_local,(unsigned_long *)&stack0xffffffffffffffd0);
  uVar1 = *puVar2;
  if (base_offset + uVar1 < 0x100000001) {
    if (base_offset + uVar1 < 0x10001) {
      if (base_offset + uVar1 < 0x101) {
        print_diff_line.offset_width_digits._4_4_ = 2;
      }
      else {
        print_diff_line.offset_width_digits._4_4_ = 4;
      }
    }
    else {
      print_diff_line.offset_width_digits._4_4_ = 8;
    }
  }
  else {
    print_diff_line.offset_width_digits._4_4_ = 0x10;
  }
  print_diff_line_pair.data2 = (uint8_t **)((long)&data1 + 7);
  print_diff_line.use_color = (bool *)&data1v_local;
  print_diff_line.stream = (FILE **)&base_offset;
  print_diff_line.base_offset = (uint64_t *)((long)&print_diff_line.offset_width_digits + 4);
  first_unprinted_line_index = (size_t)&print_diff_line_pair.data2;
  print_diff_line_pair.print_diff_line = (anon_class_32_4_ace858be *)&data2;
  print_diff_line_pair.data1 = (uint8_t **)&data2v_local;
  print_diff_line_pair.size1 = (size_t *)&stack0xffffffffffffffd0;
  print_diff_line_pair.size2 = &max_data_size;
  last_different_line_index = 0;
  num_lines = -(context_lines + 1);
  uVar3 = uVar1 + 0xf >> 4;
  for (sStack_c0 = 0; sStack_c0 < uVar3; sStack_c0 = sStack_c0 + 1) {
    within_line_offset._6_2_ = 0;
    for (offset = 0; offset < 0x10; offset = offset + 1) {
      puVar4 = (uint64_t *)(sStack_c0 * 0x10 + offset);
      if (puVar4 < data2v_local) {
        local_f4 = (uint)data2[(long)puVar4];
      }
      else {
        local_f4 = 0xffff;
      }
      if (puVar4 < puStack_30) {
        local_f8 = (uint)*(byte *)(max_data_size + (long)puVar4);
      }
      else {
        local_f8 = 0xffff;
      }
      if (local_f4 != local_f8) {
        within_line_offset._6_2_ = within_line_offset._6_2_ | (ushort)(1 << ((byte)offset & 0x1f));
      }
    }
    if (within_line_offset._6_2_ == 0) {
      if ((long)sStack_c0 <= (long)(num_lines + context_lines)) {
        print_binary_diff::anon_class_40_5_ac5c238a::operator()
                  ((anon_class_40_5_ac5c238a *)&first_unprinted_line_index,sStack_c0,0);
        last_different_line_index = sStack_c0 + 1;
      }
    }
    else {
      local_f0 = last_different_line_index;
      if (last_different_line_index + context_lines < sStack_c0) {
        local_f0 = sStack_c0 - context_lines;
        fprintf((FILE *)data1v_local,"  ...\n");
      }
      for (; local_f0 < sStack_c0; local_f0 = local_f0 + 1) {
        print_binary_diff::anon_class_40_5_ac5c238a::operator()
                  ((anon_class_40_5_ac5c238a *)&first_unprinted_line_index,local_f0,0);
      }
      print_binary_diff::anon_class_40_5_ac5c238a::operator()
                ((anon_class_40_5_ac5c238a *)&first_unprinted_line_index,sStack_c0,
                 within_line_offset._6_2_);
      last_different_line_index = sStack_c0 + 1;
      num_lines = sStack_c0;
    }
  }
  if ((ulong)last_different_line_index < uVar3) {
    fprintf((FILE *)data1v_local,"  ...\n");
  }
  return;
}

Assistant:

void print_binary_diff(
    FILE* stream,
    const void* data1v,
    size_t size1,
    const void* data2v,
    size_t size2,
    bool use_color,
    size_t context_lines,
    uint64_t base_offset = 0) {
  const uint8_t* data1 = reinterpret_cast<const uint8_t*>(data1v);
  const uint8_t* data2 = reinterpret_cast<const uint8_t*>(data2v);

  size_t max_data_size = std::max<size_t>(size1, size2);
  int offset_width_digits;
  if (base_offset + max_data_size > 0x100000000) {
    offset_width_digits = 16;
  } else if (base_offset + max_data_size > 0x10000) {
    offset_width_digits = 8;
  } else if (base_offset + max_data_size > 0x100) {
    offset_width_digits = 4;
  } else {
    offset_width_digits = 2;
  }

  auto print_diff_line = [&](char left_ch,
                             const uint8_t* data,
                             size_t size,
                             size_t line_index,
                             uint16_t diff_flags,
                             TerminalFormat color) {
    size_t line_start_offset = line_index * 0x10;
    if (use_color) {
      print_color_escape(stream, color, TerminalFormat::END);
    }
    uint64_t address = base_offset + line_start_offset;
    fprintf(stream, "%c %0*" PRIX64 " |", left_ch, offset_width_digits, address);
    for (size_t within_line_offset = 0; within_line_offset < 0x10; within_line_offset++) {
      size_t offset = (line_index * 0x10) + within_line_offset;
      if (offset < size) {
        if (use_color && (diff_flags & (1 << within_line_offset))) {
          print_color_escape(stream, color, TerminalFormat::BOLD, TerminalFormat::END);
          fprintf(stream, " %02hhX", data[offset]);
          print_color_escape(stream, TerminalFormat::NORMAL, color, TerminalFormat::END);
        } else {
          fprintf(stream, " %02hhX", data[offset]);
        }
      } else {
        fprintf(stream, "   ");
      }
    }
    fprintf(stream, " | ");
    for (size_t within_line_offset = 0; within_line_offset < 0x10; within_line_offset++) {
      size_t offset = (line_index * 0x10) + within_line_offset;
      if (offset < size) {
        char ch = data[offset];
        if (ch < 0x20 || ch > 0x7E) {
          ch = ' ';
        }
        if (use_color && (diff_flags & (1 << within_line_offset))) {
          print_color_escape(stream, color, TerminalFormat::BOLD, TerminalFormat::END);
          fputc(ch, stream);
          print_color_escape(stream, TerminalFormat::NORMAL, color, TerminalFormat::END);
        } else {
          fputc(ch, stream);
        }
      } else {
        fputc(' ', stream);
      }
    }
    if (use_color) {
      print_color_escape(stream, TerminalFormat::NORMAL, TerminalFormat::END);
    }
    fputc('\n', stream);
  };

  auto print_diff_line_pair = [&](size_t line_index, uint16_t diff_flags) -> void {
    size_t line_start_offset = line_index * 0x10;
    if (diff_flags == 0) {
      print_diff_line(' ', data1, size1, line_index, diff_flags, TerminalFormat::NORMAL);
    } else {
      if (line_start_offset < size1) {
        print_diff_line('-', data1, size1, line_index, diff_flags, TerminalFormat::FG_RED);
      }
      if (line_start_offset < size2) {
        print_diff_line('+', data2, size2, line_index, diff_flags, TerminalFormat::FG_GREEN);
      }
    }
  };

  size_t first_unprinted_line_index = 0;
  ssize_t last_different_line_index = -(context_lines + 1);
  size_t num_lines = ((max_data_size + 0x0F) >> 4);
  for (size_t line_index = 0; line_index < num_lines; line_index++) {
    uint16_t diff_flags = 0;
    for (size_t within_line_offset = 0; within_line_offset < 0x10; within_line_offset++) {
      size_t offset = (line_index * 0x10) + within_line_offset;
      uint16_t data1_value = (offset < size1) ? static_cast<uint8_t>(data1[offset]) : 0xFFFF;
      uint16_t data2_value = (offset < size2) ? static_cast<uint8_t>(data2[offset]) : 0xFFFF;
      if (data1_value != data2_value) {
        diff_flags |= (1 << within_line_offset);
      }
    }
    if (diff_flags == 0) {
      if (static_cast<ssize_t>(line_index) <= last_different_line_index + static_cast<ssize_t>(context_lines)) {
        print_diff_line_pair(line_index, diff_flags);
        first_unprinted_line_index = line_index + 1;
      }

    } else {
      bool has_unprinted_gap;
      size_t chunk_start_line_index;
      if ((first_unprinted_line_index + context_lines) >= line_index) {
        chunk_start_line_index = first_unprinted_line_index;
        has_unprinted_gap = false;
      } else {
        chunk_start_line_index = line_index - context_lines;
        has_unprinted_gap = true;
      }

      if (has_unprinted_gap) {
        fprintf(stream, "  ...\n");
      }

      for (size_t z = chunk_start_line_index; z < line_index; z++) {
        print_diff_line_pair(z, 0x0000);
      }
      print_diff_line_pair(line_index, diff_flags);
      first_unprinted_line_index = line_index + 1;
      last_different_line_index = line_index;
    }
  }

  if (first_unprinted_line_index < num_lines) {
    fprintf(stream, "  ...\n");
  }
}